

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

ssize_t __thiscall
httplib::detail::write_headers<httplib::Request>
          (detail *this,Stream *strm,Request *info,Headers *headers)

{
  bool bVar1;
  ssize_t sVar2;
  ssize_t sVar3;
  Request *pRVar4;
  long lVar5;
  _Rb_tree_node_base *p_Var6;
  undefined1 auVar7 [16];
  undefined8 local_40;
  char *local_38;
  
  lVar5 = 0;
  p_Var6 = (_Rb_tree_node_base *)strm[0xb]._vptr_Stream;
  pRVar4 = info;
  while (p_Var6 != (_Rb_tree_node_base *)(strm + 9)) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (p_Var6 + 1),"EXCEPTION_WHAT");
    if (!bVar1) {
      local_38 = *(char **)(p_Var6 + 1);
      local_40._0_4_ = p_Var6[2]._M_color;
      local_40._4_4_ = *(undefined4 *)&p_Var6[2].field_0x4;
      headers = (Headers *)&local_40;
      sVar2 = Stream::write_format<char_const*,char_const*>
                        ((Stream *)this,"%s: %s\r\n",&local_38,(char **)headers);
      if (sVar2 < 0) {
        return sVar2;
      }
      lVar5 = lVar5 + sVar2;
    }
    auVar7 = std::_Rb_tree_increment(p_Var6);
    pRVar4 = auVar7._8_8_;
    p_Var6 = auVar7._0_8_;
  }
  auVar7._8_8_ = pRVar4;
  auVar7._0_8_ = *(undefined8 *)((long)&(info->method).field_2 + 8);
  while( true ) {
    p_Var6 = auVar7._0_8_;
    if (p_Var6 == (_Rb_tree_node_base *)&(info->method)._M_string_length) {
      sVar3 = Stream::write((Stream *)this,0x127f35,auVar7._8_8_,(size_t)headers);
      if (sVar3 < 0) {
        lVar5 = 0;
      }
      return lVar5 + sVar3;
    }
    local_38 = *(char **)(p_Var6 + 1);
    local_40._0_4_ = p_Var6[2]._M_color;
    local_40._4_4_ = *(undefined4 *)&p_Var6[2].field_0x4;
    headers = (Headers *)&local_40;
    sVar2 = Stream::write_format<char_const*,char_const*>
                      ((Stream *)this,"%s: %s\r\n",&local_38,(char **)&local_40);
    if (sVar2 < 0) break;
    lVar5 = lVar5 + sVar2;
    auVar7 = std::_Rb_tree_increment(p_Var6);
  }
  return sVar2;
}

Assistant:

inline ssize_t write_headers(Stream &strm, const T &info,
									 const Headers &headers) {
			ssize_t write_len = 0;
			for (const auto &x : info.headers) {
				if (x.first == "EXCEPTION_WHAT") { continue; }
				auto len =
						strm.write_format("%s: %s\r\n", x.first.c_str(), x.second.c_str());
				if (len < 0) { return len; }
				write_len += len;
			}
			for (const auto &x : headers) {
				auto len =
						strm.write_format("%s: %s\r\n", x.first.c_str(), x.second.c_str());
				if (len < 0) { return len; }
				write_len += len;
			}
			auto len = strm.write("\r\n");
			if (len < 0) { return len; }
			write_len += len;
			return write_len;
		}